

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O3

int __thiscall mpt::source<double>::advance(source<double> *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = this->_pos;
  iVar1 = -0x10;
  if ((-1 < (long)uVar2) && (uVar3 = (this->super_span<const_double>)._len >> 3, uVar2 < uVar3)) {
    uVar2 = uVar2 + (long)this->_step;
    this->_pos = uVar2;
    iVar1 = 0;
    if (uVar2 < uVar3) {
      iVar1 = 0x19;
      if (this->_type != 0) {
        iVar1 = this->_type;
      }
    }
  }
  return iVar1;
}

Assistant:

int advance() __MPT_OVERRIDE
	{
		if (_pos < 0 || _pos >= span<const T>::size()) {
			return MissingData;
		}
		_pos += _step;
		if (_pos < 0 || _pos >= span<const T>::size()) {
			return 0;
		}
		return _type ? _type : type_properties<struct value>::id(true);
	}